

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O2

void UI::execute_simple_merge(int *argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  string *psVar3;
  string export_path;
  geofile primary_geofile;
  geofile secondary_geofile;
  allocator<char> local_569;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  string local_428;
  geofile local_408;
  geofile local_210;
  
  if (*argc == 6) {
    GEO::geofile::geofile(&local_408);
    GEO::geofile::geofile(&local_210);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_428,argv[3],(allocator<char> *)&local_568);
    iVar1 = GEO::geofile::import_geofile(&local_408,&local_428);
    std::__cxx11::string::~string((string *)&local_428);
    if (iVar1 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_448,"Imported primary geometry file successfully.",
                 (allocator<char> *)&local_568);
      print_ln(&local_448);
      std::__cxx11::string::~string((string *)&local_448);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_468,argv[4],(allocator<char> *)&local_568);
      iVar1 = GEO::geofile::import_geofile(&local_210,&local_468);
      std::__cxx11::string::~string((string *)&local_468);
      if (iVar1 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_488,"Imported secondary geometry file successfully.",
                   (allocator<char> *)&local_568);
        print_ln(&local_488);
        std::__cxx11::string::~string((string *)&local_488);
        iVar1 = GEO::geofile::merge_with(&local_408,&local_210);
        if (iVar1 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_568,argv[5],&local_569);
          std::__cxx11::string::string((string *)&local_4a8,(string *)&local_568);
          iVar1 = GEO::geofile::export_geofile(&local_408,&local_4a8);
          std::__cxx11::string::~string((string *)&local_4a8);
          if (iVar1 == 0) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4c8,"Export returned success.",&local_569);
            print_ln(&local_4c8);
            psVar3 = &local_4c8;
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4e8,"Export returned failure.",&local_569);
            print_ln(&local_4e8);
            psVar3 = &local_4e8;
          }
          std::__cxx11::string::~string((string *)psVar3);
          psVar3 = &local_568;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_508,"Error: Merge Operation Failed.",
                     (allocator<char> *)&local_568);
          print_ln(&local_508);
          psVar3 = &local_508;
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_528,"Error: Import of second file failed.",
                   (allocator<char> *)&local_568);
        print_ln(&local_528);
        psVar3 = &local_528;
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_548,"Error: Import of first file failed.",
                 (allocator<char> *)&local_568);
      print_ln(&local_548);
      psVar3 = &local_548;
    }
    std::__cxx11::string::~string((string *)psVar3);
    GEO::geofile::~geofile(&local_210);
    GEO::geofile::~geofile(&local_408);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Error: Expected 5 arguments, got ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*argc);
  poVar2 = std::operator<<(poVar2,".");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void UI::execute_simple_merge(int &argc, char *argv[])
{
    if ( argc == 6 )
    {
        GEO::geofile primary_geofile, secondary_geofile;
        if ( primary_geofile.import_geofile(argv[3]) == EXIT_SUCCESS )
        {
            print_ln("Imported primary geometry file successfully.");
            if(secondary_geofile.import_geofile(argv[4]) == EXIT_SUCCESS)
            {
                print_ln("Imported secondary geometry file successfully.");
                if (primary_geofile.merge_with(secondary_geofile)==EXIT_SUCCESS)
                {
                    std::string export_path = argv[5];
                    if(primary_geofile.export_geofile(export_path)==EXIT_SUCCESS)
                        print_ln("Export returned success.");
                    else
                        print_ln("Export returned failure.");
                }
                else
                {
                    print_ln("Error: Merge Operation Failed.");
                }
            }
            else
            {
                print_ln("Error: Import of second file failed.");
            }
        }
        else
        {
            print_ln("Error: Import of first file failed.");
        }
    }
    else
    {
        std::cout << "Error: Expected 5 arguments, got " << argc << "." << std::endl;
    }

}